

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O2

uint Validator::constraintS3(Solution *solution)

{
  pointer ppTVar1;
  Turn *this;
  uint uVar2;
  int iVar3;
  int iVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *pmVar5;
  Nurse *pNVar6;
  History *this_00;
  vector<Turn_*,_std::allocator<Turn_*>_> *pvVar7;
  Scenario *pSVar8;
  string *psVar9;
  _Base_ptr p_Var10;
  pointer ppTVar11;
  uint local_10c;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  Contract local_70;
  
  pmVar5 = Solution::getNurses_abi_cxx11_(solution);
  p_Var10 = (pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_10c = 0;
  for (; (_Rb_tree_header *)p_Var10 != &(pmVar5->_M_t)._M_impl.super__Rb_tree_header;
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
    pNVar6 = NurseSolution::getNurse(*(NurseSolution **)(p_Var10 + 2));
    this_00 = Nurse::getHistory(pNVar6);
    uVar2 = History::getNumberOfConsecutiveDaysOff(this_00);
    uVar2 = ~uVar2;
    pvVar7 = NurseSolution::getTurns(*(NurseSolution **)(p_Var10 + 2));
    ppTVar1 = (pvVar7->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppTVar11 = (pvVar7->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>)._M_impl.
                    super__Vector_impl_data._M_start; ppTVar11 != ppTVar1; ppTVar11 = ppTVar11 + 1)
    {
      this = *ppTVar11;
      iVar3 = Turn::getDay(this);
      iVar3 = ~uVar2 + iVar3;
      if (iVar3 != 0) {
        pSVar8 = Scenario::getInstance();
        pNVar6 = NurseSolution::getNurse(*(NurseSolution **)(p_Var10 + 2));
        psVar9 = Nurse::getContract_abi_cxx11_(pNVar6);
        std::__cxx11::string::string((string *)&local_90,(string *)psVar9);
        Scenario::getContract(&local_70,pSVar8,&local_90);
        iVar4 = Contract::getMinimumNumberOfConsecutiveDaysOff(&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
        if (iVar3 < iVar4) {
          pSVar8 = Scenario::getInstance();
          pNVar6 = NurseSolution::getNurse(*(NurseSolution **)(p_Var10 + 2));
          psVar9 = Nurse::getContract_abi_cxx11_(pNVar6);
          std::__cxx11::string::string((string *)&local_b0,(string *)psVar9);
          Scenario::getContract(&local_70,pSVar8,&local_b0);
          iVar4 = Contract::getMinimumNumberOfConsecutiveDaysOff(&local_70);
          local_10c = local_10c + (iVar4 - iVar3) * 0x1e;
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_b0);
        }
        else {
          pSVar8 = Scenario::getInstance();
          pNVar6 = NurseSolution::getNurse(*(NurseSolution **)(p_Var10 + 2));
          psVar9 = Nurse::getContract_abi_cxx11_(pNVar6);
          std::__cxx11::string::string((string *)&local_d0,(string *)psVar9);
          Scenario::getContract(&local_70,pSVar8,&local_d0);
          iVar4 = Contract::getMaximumNumberOfConsecutiveDaysOff(&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_d0);
          if (iVar4 < iVar3) {
            pSVar8 = Scenario::getInstance();
            pNVar6 = NurseSolution::getNurse(*(NurseSolution **)(p_Var10 + 2));
            psVar9 = Nurse::getContract_abi_cxx11_(pNVar6);
            std::__cxx11::string::string((string *)&local_f0,(string *)psVar9);
            Scenario::getContract(&local_70,pSVar8,&local_f0);
            iVar4 = Contract::getMaximumNumberOfConsecutiveDaysOff(&local_70);
            local_10c = local_10c + (iVar3 - iVar4) * 0x1e;
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::~string((string *)&local_f0);
          }
        }
      }
      uVar2 = Turn::getDay(this);
    }
  }
  return local_10c;
}

Assistant:

unsigned int Validator::constraintS3(const Solution &solution) {

    unsigned int sum = 0;

    for(auto const &nurse : solution.getNurses())
    {
        int numberOfConsecutiveDaysOff = nurse.second->getNurse()->getHistory().getNumberOfConsecutiveDaysOff();

        int lastDay = - (numberOfConsecutiveDaysOff + 1);

        for(Turn * turn : nurse.second->getTurns())
        {
            int currentDay = turn->getDay();

            int CDays = currentDay - (lastDay + 1);

            if (CDays != 0) {
                if(CDays < Scenario::getInstance()->getContract(nurse.second->getNurse()->getContract()).getMinimumNumberOfConsecutiveDaysOff())
                {
                    sum += 30 * (Scenario::getInstance()->getContract(nurse.second->getNurse()->getContract()).getMinimumNumberOfConsecutiveDaysOff() - CDays);
                }
                else if (CDays > Scenario::getInstance()->getContract(nurse.second->getNurse()->getContract()).getMaximumNumberOfConsecutiveDaysOff())
                {
                    sum += 30 * (CDays - Scenario::getInstance()->getContract(nurse.second->getNurse()->getContract()).getMaximumNumberOfConsecutiveDaysOff());
                }
            }

            lastDay = turn->getDay();
        }
    }

    return sum;
}